

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  char cVar2;
  bool bVar3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar4;
  istream *piVar5;
  ostream *poVar6;
  int iVar7;
  pointer pbVar8;
  int local_264;
  string line;
  ifstream input_file;
  
  program_options::parse(argc,argv);
  pvVar4 = program_options::input_files();
  pbVar8 = (pvVar4->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar4->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_264 = 0;
  do {
    if (pbVar8 == pbVar1) {
      return 0;
    }
    std::ifstream::ifstream((istream *)&input_file,pbVar8->_M_str,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar6 = std::operator<<((ostream *)&std::cerr,"dog: could not open input file \'");
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,pbVar8->_M_str,pbVar8->_M_len);
      std::operator<<(poVar6,"\'!\n");
      local_264 = 1;
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      iVar7 = 1;
      while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&input_file,(string *)&line),
            ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        bVar3 = program_options::show_line_numbers();
        if (bVar3) {
          *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 6;
          poVar6 = std::operator<<(&std::cout,0x20);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
          std::operator<<(poVar6,"  ");
          iVar7 = iVar7 + 1;
        }
        std::operator<<((ostream *)&std::cout,(string *)&line);
        bVar3 = program_options::show_ends();
        if (bVar3) {
          std::operator<<((ostream *)&std::cout,'$');
        }
        std::operator<<((ostream *)&std::cout,'\n');
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::~ifstream((istream *)&input_file);
    pbVar8 = pbVar8 + 1;
  } while (cVar2 != '\0');
  return local_264;
}

Assistant:

int
main(int argc, char *argv[]) {
    try {
        program_options::parse(argc, argv);
    } catch (const std::exception &x) {
        std::cerr << x.what() << '\n';
        std::cerr << "usage: dog [-n|--number] [-E|--show-ends] <input_file> ...\n";
        return EXIT_FAILURE;
    }

    for (const auto &file_name : program_options::input_files()) {
        std::ifstream input_file(file_name.data(), std::ios::in);
        if (!input_file.is_open()) {
            std::cerr << "dog: could not open input file '" << file_name << "'!\n";
            return EXIT_FAILURE;
        }

        std::string line;
        int         line_count = 1;
        while (std::getline(input_file, line)) {
            if (program_options::show_line_numbers()) {
                std::cout << std::setw(6) << std::setfill(' ') << line_count++ << "  ";
            }

            std::cout << line;

            if (program_options::show_ends()) {
                std::cout << '$';
            }

            std::cout << '\n';
        }
    }

    return EXIT_SUCCESS;
}